

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnImportMemory
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index memory_index,Limits *page_limits)

{
  Module *this_00;
  bool bVar1;
  pointer pMVar2;
  Location local_b0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_90;
  string local_88;
  string local_68;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> local_48;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderIR *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
  super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::MemoryImport>();
  string_view::to_string_abi_cxx11_(&local_68,(string_view *)&field_name_local.size_);
  pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pMVar2->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.module_name,
             (string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  string_view::to_string_abi_cxx11_(&local_88,(string_view *)&this_local);
  pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pMVar2->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.field_name,
             (string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::operator->
                     (&local_48);
  (pMVar2->memory).page_limits.initial = page_limits->initial;
  (pMVar2->memory).page_limits.max = page_limits->max;
  bVar1 = page_limits->is_shared;
  (pMVar2->memory).page_limits.has_max = page_limits->has_max;
  (pMVar2->memory).page_limits.is_shared = bVar1;
  this_00 = this->module_;
  GetLocation(&local_b0,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
            ((wabt *)&local_90,&local_48,&local_b0);
  Module::AppendField(this_00,&local_90);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_90);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::~unique_ptr
            (&local_48);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportMemory(Index import_index,
                                      string_view module_name,
                                      string_view field_name,
                                      Index memory_index,
                                      const Limits* page_limits) {
  auto import = MakeUnique<MemoryImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->memory.page_limits = *page_limits;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}